

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bob.cpp
# Opt level: O0

vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> * __thiscall
Bob::ExtractPermutationShare
          (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
           *__return_storage_ptr__,Bob *this,
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          *V,int rows,int cols)

{
  value_type vVar1;
  reference this_00;
  reference pvVar2;
  reference pvVar3;
  int local_60;
  int local_5c;
  int j;
  int i;
  undefined1 local_50 [8];
  pair<long,_long> last;
  allocator<std::pair<long,_long>_> local_2a;
  undefined1 local_29;
  int local_28;
  int local_24;
  int cols_local;
  int rows_local;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *V_local;
  Bob *this_local;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *Perm;
  
  local_29 = 0;
  local_28 = cols;
  local_24 = rows;
  _cols_local = V;
  V_local = (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)this;
  this_local = (Bob *)__return_storage_ptr__;
  std::allocator<std::pair<long,_long>_>::allocator(&local_2a);
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
            (__return_storage_ptr__,(long)rows,&local_2a);
  std::allocator<std::pair<long,_long>_>::~allocator(&local_2a);
  i = 0;
  j = 0;
  std::pair<long,_long>::pair<int,_int,_true>((pair<long,_long> *)local_50,&i,&j);
  for (local_5c = 0; local_5c < local_24; local_5c = local_5c + 1) {
    for (local_60 = 0; local_60 < local_28; local_60 = local_60 + 1) {
      this_00 = std::
                vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ::operator[](V,(long)local_5c);
      pvVar2 = std::vector<long,_std::allocator<long>_>::operator[](this_00,(long)(local_28 + -1));
      vVar1 = *pvVar2;
      pvVar3 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::
               operator[](__return_storage_ptr__,(long)local_5c);
      pvVar3->first = vVar1;
      pvVar3 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::
               operator[](__return_storage_ptr__,(long)local_5c);
      pvVar3->second = 0;
    }
  }
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::push_back
            (__return_storage_ptr__,(value_type *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<long,long>>Bob::ExtractPermutationShare(std::vector<std::vector<long>>V, int rows, int cols)
{
    std::vector<std::pair<long,long>> Perm(rows);
    std::pair<long, long> last(0,0);
    for(int i = 0; i < rows; i++)
    {
        for(int j = 0; j < cols; j++)
        {
            Perm[i].first = V[i][cols-1];   //old address
            Perm[i].second = 0;             //permuted address   
        }
    }
    Perm.push_back(last);
    return Perm;
}